

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGeometryUtil.cpp
# Opt level: O2

bool cbtGeometryUtil::areVerticesBehindPlane
               (cbtVector3 *planeNormal,cbtAlignedObjectArray<cbtVector3> *vertices,cbtScalar margin
               )

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  cbtScalar cVar5;
  
  uVar1 = vertices->m_size;
  lVar4 = 0;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if ((~((int)uVar1 >> 0x1f) & uVar1) == uVar3) break;
    cVar5 = cbtVector3::dot(planeNormal,(cbtVector3 *)((long)vertices->m_data->m_floats + lVar4));
    lVar4 = lVar4 + 0x10;
    uVar2 = uVar3 + 1;
  } while (cVar5 + planeNormal->m_floats[3] <= margin);
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool cbtGeometryUtil::areVerticesBehindPlane(const cbtVector3& planeNormal, const cbtAlignedObjectArray<cbtVector3>& vertices, cbtScalar margin)
{
	int numvertices = vertices.size();
	for (int i = 0; i < numvertices; i++)
	{
		const cbtVector3& N1 = vertices[i];
		cbtScalar dist = cbtScalar(planeNormal.dot(N1)) + cbtScalar(planeNormal[3]) - margin;
		if (dist > cbtScalar(0.))
		{
			return false;
		}
	}
	return true;
}